

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control_flow.cc
# Opt level: O3

void __thiscall
re2c::Node::naked_ways
          (Node *this,way_t *prefix,
          vector<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>_>_>
          *ways,nakeds_t *size)

{
  _Rb_tree_header *p_Var1;
  pointer *pppvVar2;
  bool bVar3;
  byte bVar4;
  _Base_ptr p_Var5;
  ulong uVar6;
  _Base_ptr *local_38;
  
  bVar3 = rule_rank_t::is_none(&(this->rule).rank);
  if (bVar3) {
    bVar3 = end(this);
    if (bVar3) {
      std::
      vector<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>_>_>
      ::push_back(ways,prefix);
      uVar6 = (long)(prefix->
                    super__Vector_base<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(prefix->
                    super__Vector_base<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3;
      if (0x3ff < uVar6) {
        uVar6 = 0x400;
      }
      uVar6 = uVar6 + size->value;
      if (0x3ff < uVar6) {
        uVar6 = 0x400;
      }
      size->value = (uint32_t)uVar6;
    }
    else {
      bVar4 = this->loop;
      if (bVar4 < 2) {
        this->loop = bVar4 + 1;
        p_Var5 = (this->arcsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var1 = &(this->arcsets)._M_t._M_impl.super__Rb_tree_header;
        if (((_Rb_tree_header *)p_Var5 != p_Var1) && (size->value != 0x400)) {
          do {
            local_38 = &p_Var5[1]._M_parent;
            std::
            vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>const*,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>const*>>
            ::
            emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>const*>
                      ((vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>const*,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>const*>>
                        *)prefix,
                       (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        **)&local_38);
            naked_ways(*(Node **)(p_Var5 + 1),prefix,ways,size);
            pppvVar2 = &(prefix->
                        super__Vector_base<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            *pppvVar2 = *pppvVar2 + -1;
            p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
            if ((_Rb_tree_header *)p_Var5 == p_Var1) break;
          } while (size->value != 0x400);
          bVar4 = this->loop - 1;
        }
        this->loop = bVar4;
      }
    }
  }
  return;
}

Assistant:

void Node::naked_ways (way_t & prefix, std::vector<way_t> & ways, nakeds_t &size)
{
	if (!rule.rank.is_none ())
	{
		return;
	}
	else if (end ())
	{
		ways.push_back (prefix);
		size = size + nakeds_t::from64(prefix.size ());
	}
	else if (loop < 2)
	{
		local_inc _ (loop);
		for (arcsets_t::iterator i = arcsets.begin ();
			i != arcsets.end () && !size.overflow (); ++i)
		{
			prefix.push_back (&i->second);
			i->first->naked_ways (prefix, ways, size);
			prefix.pop_back ();
		}
	}
}